

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void google::protobuf::DescriptorPool::InternalAddGeneratedFile
               (void *encoded_file_descriptor,int size)

{
  bool bVar1;
  LogMessage *other;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  int local_14;
  void *pvStack_10;
  int size_local;
  void *encoded_file_descriptor_local;
  
  local_14 = size;
  pvStack_10 = encoded_file_descriptor;
  anon_unknown_1::InitGeneratedPoolOnce();
  bVar1 = EncodedDescriptorDatabase::Add
                    ((anonymous_namespace)::generated_database_,pvStack_10,local_14);
  local_51 = 0;
  if (!bVar1) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0x522);
    local_51 = 1;
    other = internal::LogMessage::operator<<
                      (&local_50,
                       "CHECK failed: generated_database_->Add(encoded_file_descriptor, size): ");
    internal::LogFinisher::operator=(local_65,other);
  }
  if ((local_51 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_50);
  }
  return;
}

Assistant:

void DescriptorPool::InternalAddGeneratedFile(
    const void* encoded_file_descriptor, int size) {
  // So, this function is called in the process of initializing the
  // descriptors for generated proto classes.  Each generated .pb.cc file
  // has an internal procedure called AddDescriptors() which is called at
  // process startup, and that function calls this one in order to register
  // the raw bytes of the FileDescriptorProto representing the file.
  //
  // We do not actually construct the descriptor objects right away.  We just
  // hang on to the bytes until they are actually needed.  We actually construct
  // the descriptor the first time one of the following things happens:
  // * Someone calls a method like descriptor(), GetDescriptor(), or
  //   GetReflection() on the generated types, which requires returning the
  //   descriptor or an object based on it.
  // * Someone looks up the descriptor in DescriptorPool::generated_pool().
  //
  // Once one of these happens, the DescriptorPool actually parses the
  // FileDescriptorProto and generates a FileDescriptor (and all its children)
  // based on it.
  //
  // Note that FileDescriptorProto is itself a generated protocol message.
  // Therefore, when we parse one, we have to be very careful to avoid using
  // any descriptor-based operations, since this might cause infinite recursion
  // or deadlock.
  InitGeneratedPoolOnce();
  GOOGLE_CHECK(generated_database_->Add(encoded_file_descriptor, size));
}